

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImDrawCmd * __thiscall
ImVector<ImDrawCmd>::insert(ImVector<ImDrawCmd> *this,ImDrawCmd *it,ImDrawCmd *v)

{
  undefined8 *puVar1;
  int iVar2;
  int new_capacity;
  undefined8 uVar3;
  undefined8 uVar4;
  ImTextureID pvVar5;
  undefined8 uVar6;
  ImDrawCallback p_Var7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ImDrawCmd *pIVar12;
  
  pIVar12 = this->Data;
  if (pIVar12 <= it) {
    iVar2 = this->Size;
    lVar9 = (long)iVar2;
    if (it <= pIVar12 + lVar9) {
      lVar11 = (long)it - (long)pIVar12;
      if (iVar2 == this->Capacity) {
        if (iVar2 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar2 / 2 + iVar2;
        }
        new_capacity = iVar2 + 1;
        if (iVar2 + 1 < iVar8) {
          new_capacity = iVar8;
        }
        reserve(this,new_capacity);
        lVar9 = (long)this->Size;
        pIVar12 = this->Data;
      }
      lVar10 = lVar9 - lVar11 / 0x38;
      if (lVar10 != 0 && lVar11 / 0x38 <= lVar9) {
        memmove((void *)((long)pIVar12 + lVar11 + 0x38),(void *)((long)pIVar12 + lVar11),
                lVar10 * 0x38);
        pIVar12 = this->Data;
      }
      *(void **)((long)pIVar12 + lVar11 + 0x30) = v->UserCallbackData;
      uVar3 = *(undefined8 *)&v->ClipRect;
      uVar4 = *(undefined8 *)&(v->ClipRect).z;
      pvVar5 = v->TextureId;
      uVar6 = *(undefined8 *)&v->VtxOffset;
      p_Var7 = v->UserCallback;
      puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + 0x20);
      *puVar1 = *(undefined8 *)&v->ElemCount;
      puVar1[1] = p_Var7;
      puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + 0x10);
      *puVar1 = pvVar5;
      puVar1[1] = uVar6;
      *(undefined8 *)((long)pIVar12 + lVar11) = uVar3;
      ((undefined8 *)((long)pIVar12 + lVar11))[1] = uVar4;
      this->Size = this->Size + 1;
      return (ImDrawCmd *)(lVar11 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data + Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.h"
                ,0x71e,"T *ImVector<ImDrawCmd>::insert(const T *, const T &) [T = ImDrawCmd]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }